

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_view_suite.cpp
# Opt level: O0

void push_suite::push_increasing_predicate(void)

{
  iterator pvVar1;
  iterator pvVar2;
  iterator pvVar3;
  iterator pvVar4;
  undefined1 local_78 [8];
  array<int,_4UL> expect_3;
  array<int,_4UL> expect_2;
  array<int,_4UL> expect_1;
  array<int,_4UL> expect;
  priority_view<int,_18446744073709551615UL,_std::greater<int>_> span;
  array<int,_4UL> array;
  
  memset(&span.member.last,0,0x10);
  pvVar1 = std::array<int,_4UL>::begin((array<int,_4UL> *)&span.member.last);
  pvVar2 = std::array<int,_4UL>::end((array<int,_4UL> *)&span.member.last);
  vista::priority_view<int,18446744073709551615ul,std::greater<int>>::priority_view<int*>
            ((priority_view<int,18446744073709551615ul,std::greater<int>> *)(expect._M_elems + 2),
             pvVar1,pvVar2);
  vista::priority_view<int,_18446744073709551615UL,_std::greater<int>_>::push
            ((priority_view<int,_18446744073709551615UL,_std::greater<int>_> *)(expect._M_elems + 2)
             ,0xb);
  expect_1._M_elems[2] = 0xb;
  expect_1._M_elems[3] = 0;
  expect._M_elems[0] = 0;
  expect._M_elems[1] = 0;
  pvVar1 = std::array<int,_4UL>::begin((array<int,_4UL> *)&span.member.last);
  pvVar2 = std::array<int,_4UL>::end((array<int,_4UL> *)&span.member.last);
  pvVar3 = std::array<int,_4UL>::begin((array<int,_4UL> *)(expect_1._M_elems + 2));
  pvVar4 = std::array<int,_4UL>::end((array<int,_4UL> *)(expect_1._M_elems + 2));
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/priority_view_suite.cpp"
             ,0x184,"void push_suite::push_increasing_predicate()",pvVar1,pvVar2,pvVar3,pvVar4);
  vista::priority_view<int,_18446744073709551615UL,_std::greater<int>_>::push
            ((priority_view<int,_18446744073709551615UL,_std::greater<int>_> *)(expect._M_elems + 2)
             ,0x16);
  expect_2._M_elems[2] = 0xb;
  expect_2._M_elems[3] = 0x16;
  expect_1._M_elems[0] = 0;
  expect_1._M_elems[1] = 0;
  pvVar1 = std::array<int,_4UL>::begin((array<int,_4UL> *)&span.member.last);
  pvVar2 = std::array<int,_4UL>::end((array<int,_4UL> *)&span.member.last);
  pvVar3 = std::array<int,_4UL>::begin((array<int,_4UL> *)(expect_2._M_elems + 2));
  pvVar4 = std::array<int,_4UL>::end((array<int,_4UL> *)(expect_2._M_elems + 2));
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/priority_view_suite.cpp"
             ,0x18a,"void push_suite::push_increasing_predicate()",pvVar1,pvVar2,pvVar3,pvVar4);
  vista::priority_view<int,_18446744073709551615UL,_std::greater<int>_>::push
            ((priority_view<int,_18446744073709551615UL,_std::greater<int>_> *)(expect._M_elems + 2)
             ,0x21);
  expect_3._M_elems[2] = 0xb;
  expect_3._M_elems[3] = 0x16;
  expect_2._M_elems[0] = 0x21;
  expect_2._M_elems[1] = 0;
  pvVar1 = std::array<int,_4UL>::begin((array<int,_4UL> *)&span.member.last);
  pvVar2 = std::array<int,_4UL>::end((array<int,_4UL> *)&span.member.last);
  pvVar3 = std::array<int,_4UL>::begin((array<int,_4UL> *)(expect_3._M_elems + 2));
  pvVar4 = std::array<int,_4UL>::end((array<int,_4UL> *)(expect_3._M_elems + 2));
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/priority_view_suite.cpp"
             ,400,"void push_suite::push_increasing_predicate()",pvVar1,pvVar2,pvVar3,pvVar4);
  vista::priority_view<int,_18446744073709551615UL,_std::greater<int>_>::push
            ((priority_view<int,_18446744073709551615UL,_std::greater<int>_> *)(expect._M_elems + 2)
             ,0x2c);
  local_78._0_4_ = 0xb;
  local_78._4_4_ = 0x16;
  expect_3._M_elems[0] = 0x21;
  expect_3._M_elems[1] = 0x2c;
  pvVar1 = std::array<int,_4UL>::begin((array<int,_4UL> *)&span.member.last);
  pvVar2 = std::array<int,_4UL>::end((array<int,_4UL> *)&span.member.last);
  pvVar3 = std::array<int,_4UL>::begin((array<int,_4UL> *)local_78);
  pvVar4 = std::array<int,_4UL>::end((array<int,_4UL> *)local_78);
  boost::detail::test_all_eq_impl<std::ostream,int*,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/priority_view_suite.cpp"
             ,0x196,"void push_suite::push_increasing_predicate()",pvVar1,pvVar2,pvVar3,pvVar4);
  return;
}

Assistant:

void push_increasing_predicate()
{
    std::array<int, 4> array = {};
    priority_view<int, dynamic_extent, std::greater<int>> span(array.begin(), array.end());
    span.push(11);
    {
        std::array<int, 4> expect = { 11, 0, 0, 0 };
        BOOST_TEST_ALL_EQ(array.begin(), array.end(),
                          expect.begin(), expect.end());
    }
    span.push(22);
    {
        std::array<int, 4> expect = { 11, 22, 0, 0 };
        BOOST_TEST_ALL_EQ(array.begin(), array.end(),
                          expect.begin(), expect.end());
    }
    span.push(33);
    {
        std::array<int, 4> expect = { 11, 22, 33, 0 };
        BOOST_TEST_ALL_EQ(array.begin(), array.end(),
                          expect.begin(), expect.end());
    }
    span.push(44);
    {
        std::array<int, 4> expect = { 11, 22, 33, 44 };
        BOOST_TEST_ALL_EQ(array.begin(), array.end(),
                          expect.begin(), expect.end());
    }
}